

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_staj_visitor<char>::advance_multi_dim(basic_staj_visitor<char> *this,error_code *ec)

{
  ulong uVar1;
  undefined **local_18;
  
  uVar1 = (this->shape_).size_;
  if (uVar1 != 0) {
    if (this->state_ == multi_dim) {
      local_18 = &PTR__ser_context_00b2f9c8;
      (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[7])(this,uVar1,0);
      this->state_ = shape;
    }
    else if (this->index_ < uVar1) {
      local_18 = &PTR__ser_context_00b2f9c8;
      (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[0xf])
                (this,(this->shape_).data_[this->index_],0);
      this->index_ = this->index_ + 1;
    }
    else {
      this->state_ = 0;
      local_18 = &PTR__ser_context_00b2f9c8;
      (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])(this,&local_18,ec);
      (this->shape_).data_ = (pointer)0x0;
      (this->shape_).size_ = 0;
      this->index_ = 0;
    }
  }
  return;
}

Assistant:

void advance_multi_dim(std::error_code& ec)
    {
        if (shape_.size() != 0)
        {
            if (state_ == staj_cursor_state::multi_dim)
            {
                this->begin_array(shape_.size(), semantic_tag::none, ser_context(), ec);
                state_ = staj_cursor_state::shape;
            }
            else if (index_ < shape_.size())
            {
                this->uint64_value(shape_[index_], semantic_tag::none, ser_context(), ec);
                ++index_;
            }
            else
            {
                state_ = staj_cursor_state();
                this->end_array(ser_context(), ec);
                shape_ = jsoncons::span<const size_t>();
                index_ = 0;
            }
        }
    }